

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::UndoBuffer::Cleanup(UndoBuffer *this,transaction_t lowest_active_transaction)

{
  optional_ptr<duckdb::UndoBufferEntry,_true> *this_00;
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoBufferEntry *pUVar3;
  UndoFlags *pUVar4;
  IteratorState iterator_state;
  CleanupState state;
  IteratorState IStack_4108;
  BufferHandle local_40d8;
  CleanupState local_40c0;
  
  CleanupState::CleanupState(&local_40c0,lowest_active_transaction);
  IteratorState::IteratorState(&IStack_4108);
  this_00 = &IStack_4108.current;
  IStack_4108.current.ptr = (this->allocator).tail.ptr;
  while (IStack_4108.current.ptr != (UndoBufferEntry *)0x0) {
    pBVar2 = (this->allocator).buffer_manager;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    (*pBVar2->_vptr_BufferManager[7])(&local_40d8,pBVar2,&pUVar3->block);
    BufferHandle::operator=(&IStack_4108.handle,&local_40d8);
    BufferHandle::~BufferHandle(&local_40d8);
    pUVar4 = (UndoFlags *)BufferHandle::Ptr(&IStack_4108.handle);
    IStack_4108.start = (data_ptr_t)pUVar4;
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    IStack_4108.end = (data_ptr_t)((long)pUVar4 + pUVar3->position);
    for (; IStack_4108.start < IStack_4108.end;
        IStack_4108.start = (data_ptr_t)((ulong)UVar1 + (long)IStack_4108.start)) {
      type = *(UndoFlags *)IStack_4108.start;
      UVar1 = *(UndoFlags *)((long)IStack_4108.start + 4);
      IStack_4108.start = (data_ptr_t)((long)IStack_4108.start + 8);
      CleanupState::CleanupEntry(&local_40c0,type,IStack_4108.start);
    }
    pUVar3 = optional_ptr<duckdb::UndoBufferEntry,_true>::operator->(this_00);
    IStack_4108.current.ptr = (pUVar3->prev).ptr;
  }
  BufferHandle::~BufferHandle(&IStack_4108.handle);
  CleanupState::~CleanupState(&local_40c0);
  return;
}

Assistant:

void UndoBuffer::Cleanup(transaction_t lowest_active_transaction) {
	// garbage collect everything in the Undo Chunk
	// this should only happen if
	//  (1) the transaction this UndoBuffer belongs to has successfully
	//  committed
	//      (on Rollback the Rollback() function should be called, that clears
	//      the chunks)
	//  (2) there is no active transaction with start_id < commit_id of this
	//  transaction
	CleanupState state(lowest_active_transaction);
	UndoBuffer::IteratorState iterator_state;
	IterateEntries(iterator_state, [&](UndoFlags type, data_ptr_t data) { state.CleanupEntry(type, data); });

#ifdef DEBUG
	// Verify that our index memory is stable.
	for (auto &table : state.indexed_tables) {
		table.second->VerifyIndexBuffers();
	}
#endif
}